

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferImpl.h
# Opt level: O0

bool __thiscall
ViconCGStreamIO::VBufferImpl::ReadPod<unsigned_short>(VBufferImpl *this,unsigned_short *o_rValue)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_t sizeOfT;
  unsigned_short *o_rValue_local;
  VBufferImpl *this_local;
  
  uVar1 = this->m_Offset;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_Buffer);
  bVar2 = (ulong)uVar1 + 2 <= sVar3;
  if (bVar2) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_Buffer,0);
    *o_rValue = *(unsigned_short *)(pvVar4 + this->m_Offset);
    this->m_Offset = this->m_Offset + 2;
  }
  return bVar2;
}

Assistant:

bool ReadPod( T & o_rValue ) const
  {
   const size_t sizeOfT = sizeof( T );

   if( m_Offset + sizeOfT > m_Buffer.size() )
   {
     return false;
   }

   memcpy( &o_rValue, &m_Buffer[ 0 ] + m_Offset, sizeOfT );
   m_Offset += sizeOfT;
   return true;
  }